

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O0

DdNode * RAbuildSubset(DdManager *dd,DdNode *node,ApproxInfo *info)

{
  DdHalfWord DVar1;
  int iVar2;
  DdNode *pDVar3;
  NodeData *local_a8;
  NodeData *local_a0;
  NodeData *local_98;
  NodeData *local_90;
  NodeData *local_88;
  int index_1;
  DdNode *Nte;
  int index;
  DdNode *Ntt;
  NodeData *infoN;
  DdNode *r;
  DdNode *e;
  DdNode *t;
  DdNode *N;
  DdNode *Ne;
  DdNode *Nt;
  ApproxInfo *info_local;
  DdNode *node_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)node;
  if (*(int *)((ulong)node & 0xfffffffffffffffe) != 0x7fffffff) {
    t = (DdNode *)((ulong)node & 0xfffffffffffffffe);
    Ne = (DdNode *)((ulong)(t->type).kids.T ^ (long)(int)((uint)node & 1));
    N = (DdNode *)((ulong)(t->type).kids.E ^ (long)(int)((uint)node & 1));
    Nt = (DdNode *)info;
    info_local = (ApproxInfo *)node;
    node_local = &dd->sentinel;
    iVar2 = st__lookup(info->table,(char *)t,(char **)&Ntt);
    if (iVar2 == 0) {
      fprintf((FILE *)node_local[0xf].type.kids.T,"Something is wrong, ought to be in info table\n")
      ;
      *(undefined4 *)((long)&node_local[0xf].type + 8) = 5;
      dd_local = (DdManager *)0x0;
    }
    else {
      if ((ApproxInfo *)t == info_local) {
        if ((Ntt->type).kids.E != (DdNode *)0x0) {
          return (Ntt->type).kids.E;
        }
      }
      else if (Ntt->Id != 0) {
        return (DdNode *)Ntt->Id;
      }
      if (*(char *)((long)&Ntt->type + 5) == '\x01') {
        dd_local = (DdManager *)RAbuildSubset((DdManager *)node_local,N,(ApproxInfo *)Nt);
      }
      else if (*(char *)((long)&Ntt->type + 5) == '\x02') {
        dd_local = (DdManager *)RAbuildSubset((DdManager *)node_local,Ne,(ApproxInfo *)Nt);
      }
      else if (*(char *)((long)&Ntt->type + 5) == '\x03') {
        dd_local = (DdManager *)Nt->next;
      }
      else if (*(char *)((long)&Ntt->type + 5) == '\x04') {
        DVar1 = ((t->type).kids.T)->index;
        r = Nt->next;
        local_90 = (NodeData *)
                   RAbuildSubset((DdManager *)node_local,
                                 (DdNode *)
                                 ((ulong)(((t->type).kids.T)->type).kids.T ^
                                 (long)(int)((uint)info_local & 1)),(ApproxInfo *)Nt);
        if (local_90 == (NodeData *)0x0) {
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)local_90 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_90 & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)local_90 & 1) == 0) {
            e = (DdNode *)local_90;
            if (local_90 != (NodeData *)r) {
              local_90 = (NodeData *)
                         cuddUniqueInter((DdManager *)node_local,DVar1,(DdNode *)local_90,r);
            }
            infoN = local_90;
            if (local_90 == (NodeData *)0x0) {
              Cudd_RecursiveDeref((DdManager *)node_local,e);
              return (DdNode *)0x0;
            }
          }
          else {
            local_88 = (NodeData *)((ulong)local_90 ^ 1);
            r = (DdNode *)((ulong)r ^ 1);
            e = (DdNode *)local_88;
            if (local_88 != (NodeData *)r) {
              local_88 = (NodeData *)
                         cuddUniqueInter((DdManager *)node_local,DVar1,(DdNode *)local_88,r);
            }
            infoN = local_88;
            if (local_88 == (NodeData *)0x0) {
              Cudd_RecursiveDeref((DdManager *)node_local,e);
              return (DdNode *)0x0;
            }
            infoN = (NodeData *)((ulong)local_88 ^ 1);
          }
          *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
          dd_local = (DdManager *)infoN;
        }
      }
      else if (*(char *)((long)&Ntt->type + 5) == '\x05') {
        DVar1 = ((t->type).kids.T)->index;
        e = *(DdNode **)Nt;
        pDVar3 = RAbuildSubset((DdManager *)node_local,
                               (DdNode *)
                               ((ulong)(((t->type).kids.T)->type).kids.E ^
                               (long)(int)((uint)info_local & 1)),(ApproxInfo *)Nt);
        if (pDVar3 == (DdNode *)0x0) {
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          r = (DdNode *)((ulong)pDVar3 ^ 1);
          if (e == r) {
            local_98 = (NodeData *)e;
          }
          else {
            local_98 = (NodeData *)cuddUniqueInter((DdManager *)node_local,DVar1,e,r);
          }
          infoN = local_98;
          if (local_98 == (NodeData *)0x0) {
            Cudd_RecursiveDeref((DdManager *)node_local,r);
            dd_local = (DdManager *)0x0;
          }
          else {
            dd_local = (DdManager *)((ulong)local_98 ^ 1);
            *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + -1;
          }
        }
      }
      else {
        e = RAbuildSubset((DdManager *)node_local,Ne,(ApproxInfo *)Nt);
        if (e == (DdNode *)0x0) {
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
          r = RAbuildSubset((DdManager *)node_local,N,(ApproxInfo *)Nt);
          if (r == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)node_local,e);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
            if (((ulong)e & 1) == 0) {
              if (e == r) {
                local_a8 = (NodeData *)e;
              }
              else {
                local_a8 = (NodeData *)cuddUniqueInter((DdManager *)node_local,t->index,e,r);
              }
              infoN = local_a8;
              if (local_a8 == (NodeData *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,r);
                Cudd_RecursiveDeref((DdManager *)node_local,e);
                return (DdNode *)0x0;
              }
            }
            else {
              local_a0 = (NodeData *)((ulong)e ^ 1);
              r = (DdNode *)((ulong)r ^ 1);
              e = (DdNode *)local_a0;
              if (local_a0 != (NodeData *)r) {
                local_a0 = (NodeData *)
                           cuddUniqueInter((DdManager *)node_local,t->index,(DdNode *)local_a0,r);
              }
              infoN = local_a0;
              if (local_a0 == (NodeData *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,r);
                Cudd_RecursiveDeref((DdManager *)node_local,e);
                return (DdNode *)0x0;
              }
              infoN = (NodeData *)((ulong)local_a0 ^ 1);
            }
            *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + -1;
            if ((ApproxInfo *)t == info_local) {
              (Ntt->type).kids.E = (DdNode *)infoN;
            }
            else {
              Ntt->Id = (ABC_INT64_T)infoN;
            }
            dd_local = (DdManager *)infoN;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
RAbuildSubset(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  ApproxInfo * info /* node info */)
{
    DdNode *Nt, *Ne, *N, *t, *e, *r;
    NodeData *infoN;

    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);

    Nt = Cudd_NotCond(cuddT(N), Cudd_IsComplement(node));
    Ne = Cudd_NotCond(cuddE(N), Cudd_IsComplement(node));

    if ( st__lookup(info->table, (const char *)N, (char **)&infoN)) {
        if (N == node ) {
            if (infoN->resultP != NULL) {
                return(infoN->resultP);
            }
        } else {
            if (infoN->resultN != NULL) {
                return(infoN->resultN);
            }
        }
        if (infoN->replace == REPLACE_T) {
            r = RAbuildSubset(dd, Ne, info);
            return(r);
        } else if (infoN->replace == REPLACE_E) {
            r = RAbuildSubset(dd, Nt, info);
            return(r);
        } else if (infoN->replace == REPLACE_N) {
            return(info->zero);
        } else if (infoN->replace == REPLACE_TT) {
            DdNode *Ntt = Cudd_NotCond(cuddT(cuddT(N)),
                                       Cudd_IsComplement(node));
            int index = cuddT(N)->index;
            e = info->zero;
            t = RAbuildSubset(dd, Ntt, info);
            if (t == NULL) {
                return(NULL);
            }
            cuddRef(t);
            if (Cudd_IsComplement(t)) {
                t = Cudd_Not(t);
                e = Cudd_Not(e);
                r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
                if (r == NULL) {
                    Cudd_RecursiveDeref(dd, t);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
                if (r == NULL) {
                    Cudd_RecursiveDeref(dd, t);
                    return(NULL);
                }
            }
            cuddDeref(t);
            return(r);
        } else if (infoN->replace == REPLACE_TE) {
            DdNode *Nte = Cudd_NotCond(cuddE(cuddT(N)),
                                       Cudd_IsComplement(node));
            int index = cuddT(N)->index;
            t = info->one;
            e = RAbuildSubset(dd, Nte, info);
            if (e == NULL) {
                return(NULL);
            }
            cuddRef(e);
            e = Cudd_Not(e);
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_RecursiveDeref(dd, e);
                return(NULL);
            }
            r =Cudd_Not(r);
            cuddDeref(e);
            return(r);
        }
    } else {
        (void) fprintf(dd->err,
                       "Something is wrong, ought to be in info table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }

    t = RAbuildSubset(dd, Nt, info);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = RAbuildSubset(dd, Ne, info);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if (N == node) {
        infoN->resultP = r;
    } else {
        infoN->resultN = r;
    }

    return(r);

}